

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamHeaderValidator_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::SamHeaderValidator::ValidateGroupOrder(SamHeaderValidator *this)

{
  __type _Var1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_00000008;
  SamHeaderValidator *in_stack_00000010;
  string *groupOrder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar2 = std::__cxx11::string::empty();
  if (((((uVar2 & 1) == 0) &&
       (_Var1 = std::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8), !_Var1)) &&
      (_Var1 = std::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8), !_Var1)) &&
     (_Var1 = std::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8), !_Var1)) {
    std::operator+((char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI);
    AddError(in_stack_00000010,in_stack_00000008);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    return false;
  }
  return true;
}

Assistant:

bool SamHeaderValidator::ValidateGroupOrder(void) {

    const string& groupOrder = m_header.GroupOrder;

    // if no group order, no problem, just return OK
    if ( groupOrder.empty() )
        return true;

    // if group order is valid keyword
    if ( groupOrder == Constants::SAM_HD_GROUPORDER_NONE  ||
         groupOrder == Constants::SAM_HD_GROUPORDER_QUERY ||
         groupOrder == Constants::SAM_HD_GROUPORDER_REFERENCE
       )
    {
        return true;
    }

    // otherwise
    AddError("Invalid group order (GO): " + groupOrder);
    return false;
}